

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<tinyusdz::Token> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,MetaVariable *this)

{
  pointer pcVar1;
  Token *pTVar2;
  
  pTVar2 = tinyusdz::value::Value::as<tinyusdz::Token>(&this->_value,false);
  if (pTVar2 == (Token *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    *(undefined1 **)&__return_storage_ptr__->contained =
         (undefined1 *)((long)&__return_storage_ptr__->contained + 0x10);
    pcVar1 = (pTVar2->str_)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->contained,pcVar1,
               pcVar1 + (pTVar2->str_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }